

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O2

void anon_unknown.dwarf_98f254::SatisfactionToWitness
               (MiniscriptContext ctx,CScriptWitness *witness,CScript *script,
               TaprootBuilder *builder)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  long in_FS_OFFSET;
  const_iterator local_98;
  TaprootSpendData local_90;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (script->super_CScriptBase)._size;
  local_90.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ = script;
  if (0x1c < uVar1) {
    local_90.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ =
         (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
  }
  uVar3 = uVar1 - 0x1d;
  if (0x1c >= uVar1) {
    uVar3 = uVar1;
  }
  local_98.ptr = (uchar *)((long)&(((CScript *)
                                   local_90.internal_key.m_keydata.super_base_blob<256U>.m_data.
                                   _M_elems._0_8_)->super_CScriptBase)._union + (long)(int)uVar3);
  std::
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::
  emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,prevector<28u,unsigned_char,unsigned_int,int>::const_iterator>
            ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)witness,(const_iterator *)&local_90,&local_98);
  bVar2 = miniscript::IsTapscript(ctx);
  if (bVar2) {
    TaprootBuilder::GetSpendData(&local_90,builder);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::push_back(&witness->stack,
                (value_type *)
                (local_90.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left[2]._M_right +
                1));
    std::
    _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                 *)((long)&local_90 + 0x40));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SatisfactionToWitness(miniscript::MiniscriptContext ctx, CScriptWitness& witness, const CScript& script, TaprootBuilder& builder) {
    // For P2WSH, it's only the witness script.
    witness.stack.emplace_back(script.begin(), script.end());
    if (!miniscript::IsTapscript(ctx)) return;
    // For Tapscript we also need the control block.
    witness.stack.push_back(*builder.GetSpendData().scripts.begin()->second.begin());
}